

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderStorageTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_4::max_combined_block_number_limit
               (NegativeTestContext *ctx)

{
  NegativeTestContext *ctx_00;
  bool bVar1;
  int iVar2;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  MessageBuilder local_670;
  ProgramSources local_4f0;
  MessageBuilder local_420;
  MessageBuilder local_2a0;
  GLint local_120;
  int local_11c;
  int maxCombinedSSBlocks;
  int combinedSSBlocks;
  ProgramSources sources;
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"maxCombinedShaderStorageBlocks: Exceed limits",&local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  glu::ProgramSources::ProgramSources((ProgramSources *)&maxCombinedSSBlocks);
  local_11c = 0;
  local_120 = 0;
  iVar2 = genMaxSSBlocksSource(local_10,0x8b31,(ProgramSources *)&maxCombinedSSBlocks);
  local_11c = local_11c + iVar2;
  iVar2 = genMaxSSBlocksSource(local_10,0x8b30,(ProgramSources *)&maxCombinedSSBlocks);
  local_11c = local_11c + iVar2;
  bVar1 = NegativeTestContext::isShaderSupported(local_10,SHADERTYPE_TESSELLATION_CONTROL);
  if ((bVar1) &&
     (bVar1 = NegativeTestContext::isShaderSupported(local_10,SHADERTYPE_TESSELLATION_EVALUATION),
     bVar1)) {
    iVar2 = genMaxSSBlocksSource(local_10,0x8e88,(ProgramSources *)&maxCombinedSSBlocks);
    local_11c = local_11c + iVar2;
    iVar2 = genMaxSSBlocksSource(local_10,0x8e87,(ProgramSources *)&maxCombinedSSBlocks);
    local_11c = iVar2 + local_11c;
  }
  bVar1 = NegativeTestContext::isShaderSupported(local_10,SHADERTYPE_GEOMETRY);
  if (bVar1) {
    iVar2 = genMaxSSBlocksSource(local_10,0x8dd9,(ProgramSources *)&maxCombinedSSBlocks);
    local_11c = iVar2 + local_11c;
  }
  glu::CallLogWrapper::glGetIntegerv(&local_10->super_CallLogWrapper,0x90dc,&local_120);
  pTVar3 = glu::CallLogWrapper::getLog(&local_10->super_CallLogWrapper);
  tcu::TestLog::operator<<(&local_2a0,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_2a0,(char (*) [40])0x2c44650);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_120);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_2a0);
  pTVar3 = glu::CallLogWrapper::getLog(&local_10->super_CallLogWrapper);
  tcu::TestLog::operator<<(&local_420,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<
                     (&local_420,(char (*) [33])"Combined shader storage blocks: ");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_11c);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_420);
  ctx_00 = local_10;
  if (local_120 < local_11c) {
    glu::ProgramSources::ProgramSources(&local_4f0,(ProgramSources *)&maxCombinedSSBlocks);
    verifyProgram(ctx_00,&local_4f0);
    glu::ProgramSources::~ProgramSources(&local_4f0);
  }
  else {
    pTVar3 = glu::CallLogWrapper::getLog(&local_10->super_CallLogWrapper);
    tcu::TestLog::operator<<(&local_670,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_670,
                        (char (*) [87])
                        "Test skipped: Combined shader storage blocks < GL_MAX_COMBINED_SHADER_STORAGE_BLOCKS: "
                       );
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_670);
  }
  NegativeTestContext::endSection(local_10);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&maxCombinedSSBlocks);
  return;
}

Assistant:

void max_combined_block_number_limit (NegativeTestContext& ctx)
{
	ctx.beginSection("maxCombinedShaderStorageBlocks: Exceed limits");

	glu::ProgramSources sources;

	int combinedSSBlocks	= 0;
	int maxCombinedSSBlocks = 0;

	combinedSSBlocks += genMaxSSBlocksSource(ctx, GL_VERTEX_SHADER, sources);
	combinedSSBlocks += genMaxSSBlocksSource(ctx, GL_FRAGMENT_SHADER, sources);

	if ((ctx.isShaderSupported(glu::SHADERTYPE_TESSELLATION_CONTROL)) && (ctx.isShaderSupported(glu::SHADERTYPE_TESSELLATION_EVALUATION)))
	{
		combinedSSBlocks += genMaxSSBlocksSource(ctx, GL_TESS_CONTROL_SHADER, sources);
		combinedSSBlocks += genMaxSSBlocksSource(ctx, GL_TESS_EVALUATION_SHADER, sources);
	}

	if (ctx.isShaderSupported(glu::SHADERTYPE_GEOMETRY))
		combinedSSBlocks += genMaxSSBlocksSource(ctx, GL_GEOMETRY_SHADER, sources);

	ctx.glGetIntegerv(GL_MAX_COMBINED_SHADER_STORAGE_BLOCKS, &maxCombinedSSBlocks);

	ctx.getLog() << tcu::TestLog::Message << "GL_MAX_COMBINED_SHADER_STORAGE_BLOCKS: " << maxCombinedSSBlocks << tcu::TestLog::EndMessage;
	ctx.getLog() << tcu::TestLog::Message << "Combined shader storage blocks: " << combinedSSBlocks << tcu::TestLog::EndMessage;

	if (combinedSSBlocks > maxCombinedSSBlocks)
		verifyProgram(ctx, sources);
	else
		ctx.getLog() << tcu::TestLog::Message << "Test skipped: Combined shader storage blocks < GL_MAX_COMBINED_SHADER_STORAGE_BLOCKS: " << tcu::TestLog::EndMessage;

	ctx.endSection();
}